

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void btreeHeapInsert(u32 *aHeap,u32 x)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar1 = *aHeap + 1;
  *aHeap = uVar1;
  aHeap[uVar1] = x;
  uVar3 = (ulong)uVar1;
  while( true ) {
    if ((uint)uVar3 < 2) {
      return;
    }
    uVar2 = (uint)uVar3 >> 1;
    uVar1 = aHeap[uVar2];
    if (uVar1 <= aHeap[uVar3]) break;
    aHeap[uVar2] = aHeap[uVar3];
    aHeap[uVar3] = uVar1;
    uVar3 = (ulong)uVar2;
  }
  return;
}

Assistant:

static void btreeHeapInsert(u32 *aHeap, u32 x){
  u32 j, i = ++aHeap[0];
  aHeap[i] = x;
  while( (j = i/2)>0 && aHeap[j]>aHeap[i] ){
    x = aHeap[j];
    aHeap[j] = aHeap[i];
    aHeap[i] = x;
    i = j;
  }
}